

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec08.c
# Opt level: O0

void If_Dec08MoveTo(word *pF,int nVars,int v,int p,int *Pla2Var,int *Var2Pla)

{
  int iVar;
  bool bVar1;
  word *pwVar2;
  int iVar3;
  int Count;
  int iPlace1;
  int iPlace0;
  word *pTemp;
  word *pOut;
  word *pIn;
  word pG [16];
  int *Var2Pla_local;
  int *Pla2Var_local;
  int p_local;
  int v_local;
  int nVars_local;
  word *pF_local;
  
  pTemp = (word *)&pIn;
  bVar1 = false;
  pOut = pF;
  if (p < Var2Pla[v]) {
    __assert_fail("Var2Pla[v] <= p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                  ,0xf4,"void If_Dec08MoveTo(word *, int, int, int, int *, int *)");
  }
  while (pwVar2 = pOut, Var2Pla[v] != p) {
    iVar = Var2Pla[v];
    iVar3 = Var2Pla[v] + 1;
    If_Dec08SwapAdjacent(pTemp,pOut,iVar,nVars);
    pOut = pTemp;
    pTemp = pwVar2;
    Var2Pla[Pla2Var[iVar]] = Var2Pla[Pla2Var[iVar]] + 1;
    Var2Pla[Pla2Var[iVar3]] = Var2Pla[Pla2Var[iVar3]] + -1;
    Pla2Var[iVar] = Pla2Var[iVar3] ^ Pla2Var[iVar];
    Pla2Var[iVar3] = Pla2Var[iVar] ^ Pla2Var[iVar3];
    Pla2Var[iVar] = Pla2Var[iVar3] ^ Pla2Var[iVar];
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (bVar1) {
    If_Dec08Copy(pF,pOut,nVars);
  }
  if (Pla2Var[p] != v) {
    __assert_fail("Pla2Var[p] == v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                  ,0x104,"void If_Dec08MoveTo(word *, int, int, int, int *, int *)");
  }
  return;
}

Assistant:

static inline void If_Dec08MoveTo( word * pF, int nVars, int v, int p, int Pla2Var[], int Var2Pla[] )
{
    word pG[16], * pIn = pF, * pOut = pG, * pTemp;
    int iPlace0, iPlace1, Count = 0;
    assert( Var2Pla[v] <= p );
    while ( Var2Pla[v] != p )
    {
        iPlace0 = Var2Pla[v];
        iPlace1 = Var2Pla[v]+1;
        If_Dec08SwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    if ( Count & 1 )
        If_Dec08Copy( pF, pIn, nVars );
    assert( Pla2Var[p] == v );
}